

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_striped_avx2_256_32.c
# Opt level: O3

parasail_result_t *
parasail_sw_table_striped_profile_avx2_256_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  __m256i alVar1;
  void *pvVar2;
  parasail_matrix_t *ppVar3;
  int *piVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  int iVar9;
  __m256i *palVar10;
  __m256i c;
  int iVar11;
  parasail_result_t *result;
  __m256i *b;
  __m256i *palVar12;
  __m256i *b_00;
  ulong uVar13;
  long lVar14;
  uint uVar15;
  __m256i *palVar16;
  long lVar17;
  long lVar18;
  uint uVar19;
  long lVar20;
  ulong uVar21;
  int iVar22;
  ulong size;
  bool bVar23;
  undefined1 auVar24 [32];
  undefined1 auVar25 [64];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [64];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined8 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  int iVar34;
  undefined4 in_stack_fffffffffffffee4;
  int iVar35;
  undefined8 in_stack_fffffffffffffee8;
  __m256i *ptr;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  __m256i *local_108;
  ulong local_f0;
  undefined1 auVar28 [64];
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sw_table_striped_profile_avx2_256_32_cold_8();
  }
  else {
    pvVar2 = (profile->profile32).score;
    if (pvVar2 == (void *)0x0) {
      parasail_sw_table_striped_profile_avx2_256_32_cold_7();
    }
    else {
      ppVar3 = profile->matrix;
      if (ppVar3 == (parasail_matrix_t *)0x0) {
        parasail_sw_table_striped_profile_avx2_256_32_cold_6();
      }
      else {
        uVar15 = profile->s1Len;
        if ((int)uVar15 < 1) {
          parasail_sw_table_striped_profile_avx2_256_32_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sw_table_striped_profile_avx2_256_32_cold_4();
        }
        else {
          local_f0 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            parasail_sw_table_striped_profile_avx2_256_32_cold_3();
          }
          else if (open < 0) {
            parasail_sw_table_striped_profile_avx2_256_32_cold_2();
          }
          else if (gap < 0) {
            parasail_sw_table_striped_profile_avx2_256_32_cold_1();
          }
          else {
            uVar13 = (ulong)uVar15 + 7;
            iVar11 = ppVar3->max;
            uVar19 = (uint)uVar13 & 0x7ffffff8;
            result = parasail_result_new_table1(uVar19,s2Len);
            if (result != (parasail_result_t *)0x0) {
              size = uVar13 >> 3;
              result->flag = result->flag | 0x8420804;
              b = parasail_memalign___m256i(0x20,size);
              palVar12 = parasail_memalign___m256i(0x20,size);
              local_108 = parasail_memalign___m256i(0x20,size);
              b_00 = parasail_memalign___m256i(0x20,size);
              if ((b_00 != (__m256i *)0x0 && local_108 != (__m256i *)0x0) &&
                  (palVar12 != (__m256i *)0x0 && b != (__m256i *)0x0)) {
                alVar1[1]._0_4_ = in_stack_fffffffffffffee0;
                alVar1[0] = in_stack_fffffffffffffed8;
                alVar1[1]._4_4_ = in_stack_fffffffffffffee4;
                alVar1[2] = in_stack_fffffffffffffee8;
                alVar1[3]._0_4_ = in_stack_fffffffffffffef0;
                alVar1[3]._4_4_ = in_stack_fffffffffffffef4;
                parasail_memset___m256i(b,alVar1,size);
                c[1]._0_4_ = in_stack_fffffffffffffee0;
                c[0] = in_stack_fffffffffffffed8;
                c[1]._4_4_ = in_stack_fffffffffffffee4;
                c[2] = in_stack_fffffffffffffee8;
                c[3]._0_4_ = in_stack_fffffffffffffef0;
                c[3]._4_4_ = in_stack_fffffffffffffef4;
                parasail_memset___m256i(b_00,c,size);
                auVar8._4_4_ = gap;
                auVar8._0_4_ = gap;
                auVar8._8_4_ = gap;
                auVar8._12_4_ = gap;
                auVar8._16_4_ = gap;
                auVar8._20_4_ = gap;
                auVar8._24_4_ = gap;
                auVar8._28_4_ = gap;
                auVar7._4_4_ = open;
                auVar7._0_4_ = open;
                auVar7._8_4_ = open;
                auVar7._12_4_ = open;
                auVar7._16_4_ = open;
                auVar7._20_4_ = open;
                auVar7._24_4_ = open;
                auVar7._28_4_ = open;
                iVar9 = (int)size;
                lVar17 = size * local_f0;
                iVar34 = -0x40000000;
                auVar26._8_4_ = 0xc0000000;
                auVar26._0_8_ = 0xc0000000c0000000;
                auVar26._12_4_ = 0xc0000000;
                auVar26._16_4_ = 0xc0000000;
                auVar26._20_4_ = 0xc0000000;
                auVar26._24_4_ = 0xc0000000;
                auVar26._28_4_ = 0xc0000000;
                auVar28 = ZEXT3264(auVar26);
                lVar14 = 0;
                uVar21 = 0;
                auVar25 = ZEXT3264(auVar26);
                iVar22 = 0;
                do {
                  ptr = b;
                  iVar35 = ppVar3->mapper[(byte)s2[uVar21]];
                  palVar16 = local_108;
                  b = palVar12;
                  if (iVar22 == (int)uVar21 + -2) {
                    palVar16 = palVar12;
                    b = local_108;
                  }
                  alVar1 = ptr[iVar9 - 1];
                  auVar26 = vperm2i128_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar1,0x28);
                  auVar26 = vpalignr_avx2((undefined1  [32])alVar1,auVar26,0xc);
                  lVar18 = 0;
                  auVar31 = ZEXT1664((undefined1  [16])0x0);
                  lVar20 = lVar14;
                  do {
                    auVar29 = vpaddd_avx2(auVar26,*(undefined1 (*) [32])
                                                   ((long)pvVar2 +
                                                   lVar18 + size * (long)iVar35 * 0x20));
                    auVar26 = *(undefined1 (*) [32])((long)*b_00 + lVar18);
                    auVar24 = vpmaxsd_avx2(auVar26,auVar31._0_32_);
                    auVar29 = vpmaxsd_avx2(auVar29,auVar24);
                    auVar29 = vpmaxsd_avx2(auVar29,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
                    *(undefined1 (*) [32])((long)*b + lVar18) = auVar29;
                    piVar4 = ((result->field_4).rowcols)->score_row;
                    *(int *)((long)piVar4 + lVar20) = auVar29._0_4_;
                    *(int *)((long)piVar4 + lVar17 * 4 + lVar20) = auVar29._4_4_;
                    *(int *)((long)piVar4 + lVar17 * 8 + lVar20) = auVar29._8_4_;
                    *(int *)((long)piVar4 + lVar17 * 0xc + lVar20) = auVar29._12_4_;
                    *(int *)((long)piVar4 + lVar17 * 0x10 + lVar20) = auVar29._16_4_;
                    *(int *)((long)piVar4 + lVar17 * 0x14 + lVar20) = auVar29._20_4_;
                    *(int *)((long)piVar4 + lVar17 * 0x18 + lVar20) = auVar29._24_4_;
                    *(int *)((long)piVar4 + lVar17 * 0x1c + lVar20) = auVar29._28_4_;
                    auVar24 = vpmaxsd_avx2(auVar29,auVar25._0_32_);
                    auVar25 = ZEXT3264(auVar24);
                    auVar29 = vpsubd_avx2(auVar29,auVar7);
                    auVar26 = vpsubd_avx2(auVar26,auVar8);
                    auVar26 = vpmaxsd_avx2(auVar26,auVar29);
                    *(undefined1 (*) [32])((long)*b_00 + lVar18) = auVar26;
                    auVar26 = vpsubd_avx2(auVar31._0_32_,auVar8);
                    auVar26 = vpmaxsd_avx2(auVar26,auVar29);
                    auVar31 = ZEXT3264(auVar26);
                    auVar26 = *(undefined1 (*) [32])((long)*ptr + lVar18);
                    lVar18 = lVar18 + 0x20;
                    lVar20 = lVar20 + local_f0 * 4;
                  } while (size << 5 != lVar18);
                  iVar35 = 0;
                  do {
                    auVar29 = auVar31._0_32_;
                    auVar26 = vperm2i128_avx2(auVar29,auVar29,8);
                    auVar26 = vpalignr_avx2(auVar29,auVar26,0xc);
                    auVar31 = ZEXT3264(auVar26);
                    lVar18 = 0;
                    lVar20 = lVar14;
                    do {
                      auVar26 = vpmaxsd_avx2(auVar31._0_32_,
                                             *(undefined1 (*) [32])((long)*b + lVar18));
                      *(undefined1 (*) [32])((long)*b + lVar18) = auVar26;
                      piVar4 = ((result->field_4).rowcols)->score_row;
                      *(int *)((long)piVar4 + lVar20) = auVar26._0_4_;
                      *(int *)((long)piVar4 + lVar17 * 4 + lVar20) = auVar26._4_4_;
                      *(int *)((long)piVar4 + lVar17 * 8 + lVar20) = auVar26._8_4_;
                      *(int *)((long)piVar4 + lVar17 * 0xc + lVar20) = auVar26._12_4_;
                      *(int *)((long)piVar4 + lVar17 * 0x10 + lVar20) = auVar26._16_4_;
                      *(int *)((long)piVar4 + lVar17 * 0x14 + lVar20) = auVar26._20_4_;
                      *(int *)((long)piVar4 + lVar17 * 0x18 + lVar20) = auVar26._24_4_;
                      *(int *)((long)piVar4 + lVar17 * 0x1c + lVar20) = auVar26._28_4_;
                      auVar29 = vpmaxsd_avx2(auVar26,auVar25._0_32_);
                      auVar25 = ZEXT3264(auVar29);
                      auVar26 = vpsubd_avx2(auVar26,auVar7);
                      auVar24 = vpsubd_avx2(auVar31._0_32_,auVar8);
                      auVar31 = ZEXT3264(auVar24);
                      auVar26 = vpcmpgtd_avx2(auVar24,auVar26);
                      if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (auVar26 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               ) && (auVar26 >> 0x5f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) && SUB321(auVar26 >> 0x7f,0) == '\0') &&
                            (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(auVar26 >> 0xbf,0) == '\0') &&
                          (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < auVar26[0x1f]) goto LAB_007c201c;
                      lVar18 = lVar18 + 0x20;
                      lVar20 = lVar20 + local_f0 * 4;
                    } while (size << 5 != lVar18);
                    iVar35 = iVar35 + 1;
                  } while (iVar35 != 8);
LAB_007c201c:
                  auVar26 = vpcmpgtd_avx2(auVar29,auVar28._0_32_);
                  if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar26 >> 0x7f,0) != '\0') ||
                        (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar26 >> 0xbf,0) != '\0') ||
                      (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar26[0x1f] < '\0') {
                    auVar26 = vpermq_avx2(auVar29,0x44);
                    auVar26 = vpmaxsd_avx2(auVar29,auVar26);
                    auVar29 = vpslldq_avx2(auVar26,8);
                    auVar26 = vpmaxsd_avx2(auVar26,auVar29);
                    auVar29 = vpslldq_avx2(auVar26,4);
                    auVar26 = vpmaxsd_avx2(auVar26,auVar29);
                    iVar34 = auVar26._28_4_;
                    if (0x7ffffffe - iVar11 < iVar34) {
                      *(byte *)&result->flag = (byte)result->flag | 0x40;
                      local_f0 = uVar21;
                      break;
                    }
                    auVar29._8_4_ = 7;
                    auVar29._0_8_ = 0x700000007;
                    auVar29._12_4_ = 7;
                    auVar29._16_4_ = 7;
                    auVar29._20_4_ = 7;
                    auVar29._24_4_ = 7;
                    auVar29._28_4_ = 7;
                    auVar26 = vpermd_avx2(auVar29,auVar26);
                    auVar28 = ZEXT3264(auVar26);
                    iVar22 = (int)uVar21;
                  }
                  uVar21 = uVar21 + 1;
                  lVar14 = lVar14 + 4;
                  palVar12 = ptr;
                  local_108 = palVar16;
                } while (uVar21 != local_f0);
                if (iVar34 == 0x7fffffff) {
                  *(byte *)&result->flag = (byte)result->flag | 0x40;
                }
                iVar11 = parasail_result_is_saturated(result);
                palVar12 = palVar16;
                if (iVar11 == 0) {
                  palVar10 = ptr;
                  if (iVar22 == (int)local_f0 + -2) {
                    palVar12 = ptr;
                    palVar10 = palVar16;
                  }
                  if (iVar22 == (int)local_f0 + -1) {
                    palVar12 = b;
                    b = palVar16;
                    palVar10 = ptr;
                  }
                  ptr = palVar10;
                  uVar15 = uVar15 - 1;
                  bVar23 = (uVar13 & 0x7ffffff8) == 0;
                  if (!bVar23) {
                    if (bVar23) {
                      uVar13 = 0;
                      do {
                        uVar19 = (uint)(uVar13 >> 3) & 0x1fffffff;
                        if ((int)uVar15 <= (int)uVar19) {
                          uVar19 = uVar15;
                        }
                        if (*(int *)((long)*palVar12 + uVar13 * 4) != iVar34) {
                          uVar19 = uVar15;
                        }
                        uVar15 = uVar19;
                        uVar13 = uVar13 + 1;
                      } while ((int)uVar13 != 0);
                    }
                    else {
                      auVar24._4_4_ = uVar15;
                      auVar24._0_4_ = uVar15;
                      auVar24._8_4_ = uVar15;
                      auVar24._12_4_ = uVar15;
                      auVar24._16_4_ = uVar15;
                      auVar24._20_4_ = uVar15;
                      auVar24._24_4_ = uVar15;
                      auVar24._28_4_ = uVar15;
                      auVar27._4_4_ = iVar34;
                      auVar27._0_4_ = iVar34;
                      auVar27._8_4_ = iVar34;
                      auVar27._12_4_ = iVar34;
                      auVar27._16_4_ = iVar34;
                      auVar27._20_4_ = iVar34;
                      auVar27._24_4_ = iVar34;
                      auVar27._28_4_ = iVar34;
                      auVar30._4_4_ = iVar9;
                      auVar30._0_4_ = iVar9;
                      auVar30._8_4_ = iVar9;
                      auVar30._12_4_ = iVar9;
                      auVar30._16_4_ = iVar9;
                      auVar30._20_4_ = iVar9;
                      auVar30._24_4_ = iVar9;
                      auVar30._28_4_ = iVar9;
                      auVar8 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
                      uVar13 = 0;
                      auVar32._8_4_ = 7;
                      auVar32._0_8_ = 0x700000007;
                      auVar32._12_4_ = 7;
                      auVar32._16_4_ = 7;
                      auVar32._20_4_ = 7;
                      auVar32._24_4_ = 7;
                      auVar32._28_4_ = 7;
                      auVar33._8_4_ = 8;
                      auVar33._0_8_ = 0x800000008;
                      auVar33._12_4_ = 8;
                      auVar33._16_4_ = 8;
                      auVar33._20_4_ = 8;
                      auVar33._24_4_ = 8;
                      auVar33._28_4_ = 8;
                      do {
                        auVar26 = vpcmpeqd_avx2(auVar27,*(undefined1 (*) [32])
                                                         ((long)*palVar12 + uVar13 * 4));
                        auVar29 = vpsrld_avx2(auVar8,3);
                        auVar7 = vpand_avx2(auVar8,auVar32);
                        auVar7 = vpmulld_avx2(auVar7,auVar30);
                        auVar7 = vpaddd_avx2(auVar7,auVar29);
                        auVar7 = vpminsd_avx2(auVar7,auVar24);
                        auVar24 = vblendvps_avx(auVar24,auVar7,auVar26);
                        uVar13 = uVar13 + 8;
                        auVar8 = vpaddd_avx2(auVar8,auVar33);
                      } while (uVar19 != uVar13);
                      auVar5 = vpminsd_avx(auVar24._0_16_,auVar24._16_16_);
                      auVar6 = vpshufd_avx(auVar5,0xee);
                      auVar5 = vpminsd_avx(auVar5,auVar6);
                      auVar6 = vpshufd_avx(auVar5,0x55);
                      auVar5 = vpminsd_avx(auVar5,auVar6);
                      uVar15 = auVar5._0_4_;
                    }
                  }
                }
                else {
                  iVar22 = 0;
                  iVar34 = 0x7fffffff;
                  uVar15 = 0;
                }
                result->score = iVar34;
                result->end_query = uVar15;
                result->end_ref = iVar22;
                parasail_free(b_00);
                parasail_free(palVar12);
                parasail_free(ptr);
                parasail_free(b);
                return result;
              }
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m256i* restrict vProfile = NULL;
    __m256i* restrict pvHStore = NULL;
    __m256i* restrict pvHLoad = NULL;
    __m256i* restrict pvHMax = NULL;
    __m256i* restrict pvE = NULL;
    __m256i vGapO;
    __m256i vGapE;
    __m256i vZero;
    __m256i vNegInf;
    int32_t score = 0;
    __m256i vMaxH;
    __m256i vMaxHUnit;
    int32_t maxp = 0;
    /*int32_t stop = 0;*/
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    vProfile = (__m256i*)profile->profile32.score;
    vGapO = _mm256_set1_epi32(open);
    vGapE = _mm256_set1_epi32(gap);
    vZero = _mm256_setzero_si256();
    vNegInf = _mm256_set1_epi32(NEG_INF);
    score = NEG_INF;
    vMaxH = vNegInf;
    vMaxHUnit = vNegInf;
    maxp = INT32_MAX - (int32_t)(matrix->max+1);
    /*stop = profile->stop == INT32_MAX ?  INT32_MAX : (int32_t)profile->stop;*/

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m256i(32, segLen);
    pvHLoad =  parasail_memalign___m256i(32, segLen);
    pvHMax = parasail_memalign___m256i(32, segLen);
    pvE = parasail_memalign___m256i(32, segLen);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMax) return NULL;
    if (!pvE) return NULL;

    /* initialize H and E */
    parasail_memset___m256i(pvHStore, vZero, segLen);
    parasail_memset___m256i(pvE, _mm256_set1_epi32(-open), segLen);

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        __m256i vF;
        __m256i vH;
        const __m256i* vP = NULL;
        __m256i* pv = NULL;

        /* Initialize F value to 0.  Any errors to vH values will be
         * corrected in the Lazy_F loop. */
        vF = vZero;

        /* load final segment of pvHStore and shift left by 4 bytes */
        vH = _mm256_load_si256(&pvHStore[segLen - 1]);
        vH = _mm256_slli_si256_rpl(vH, 4);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        if (end_ref == j-2) {
            /* Swap in the max buffer. */
            pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }
        else {
            /* Swap the 2 H buffers. */
            pv = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm256_add_epi32(vH, _mm256_load_si256(vP + i));
            vE = _mm256_load_si256(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm256_max_epi32(vH, vE);
            vH = _mm256_max_epi32(vH, vF);
            vH = _mm256_max_epi32(vH, vZero);
            /* Save vH values. */
            _mm256_store_si256(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vMaxH = _mm256_max_epi32(vH, vMaxH);

            /* Update vE value. */
            vH = _mm256_sub_epi32(vH, vGapO);
            vE = _mm256_sub_epi32(vE, vGapE);
            vE = _mm256_max_epi32(vE, vH);
            _mm256_store_si256(pvE + i, vE);

            /* Update vF value. */
            vF = _mm256_sub_epi32(vF, vGapE);
            vF = _mm256_max_epi32(vF, vH);

            /* Load the next vH. */
            vH = _mm256_load_si256(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            vF = _mm256_slli_si256_rpl(vF, 4);
            for (i=0; i<segLen; ++i) {
                vH = _mm256_load_si256(pvHStore + i);
                vH = _mm256_max_epi32(vH,vF);
                _mm256_store_si256(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
                arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vMaxH = _mm256_max_epi32(vH, vMaxH);
                vH = _mm256_sub_epi32(vH, vGapO);
                vF = _mm256_sub_epi32(vF, vGapE);
                if (! _mm256_movemask_epi8(_mm256_cmpgt_epi32(vF, vH))) goto end;
                /*vF = _mm256_max_epi32(vF, vH);*/
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm256_load_si256(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 4);
            }
            result->rowcols->score_row[j] = (int32_t) _mm256_extract_epi32_rpl (vH, 7);
        }
#endif

        {
            __m256i vCompare = _mm256_cmpgt_epi32(vMaxH, vMaxHUnit);
            if (_mm256_movemask_epi8(vCompare)) {
                score = _mm256_hmax_epi32_rpl(vMaxH);
                /* if score has potential to overflow, abort early */
                if (score > maxp) {
                    result->flag |= PARASAIL_FLAG_SATURATED;
                    break;
                }
                vMaxHUnit = _mm256_set1_epi32(score);
                end_ref = j;
            }
        }

        /*if (score == stop) break;*/
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvHStore+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    if (score == INT32_MAX) {
        result->flag |= PARASAIL_FLAG_SATURATED;
    }

    if (parasail_result_is_saturated(result)) {
        score = INT32_MAX;
        end_query = 0;
        end_ref = 0;
    }
    else {
        if (end_ref == j-1) {
            /* end_ref was the last store column */
            __m256i *pv = pvHMax;
            pvHMax = pvHStore;
            pvHStore = pv;
        }
        else if (end_ref == j-2) {
            /* end_ref was the last load column */
            __m256i *pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pv;
        }
        /* Trace the alignment ending position on read. */
        {
            int32_t *t = (int32_t*)pvHMax;
            int32_t column_len = segLen * segWidth;
            end_query = s1Len - 1;
            for (i = 0; i<column_len; ++i, ++t) {
                if (*t == score) {
                    int32_t temp = i / segWidth + i % segWidth * segLen;
                    if (temp < end_query) {
                        end_query = temp;
                    }
                }
            }
        }
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvE);
    parasail_free(pvHMax);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}